

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::~Window(Window *this)

{
  (this->super_IWindow).super_IOrderable._vptr_IOrderable = (_func_int **)&PTR__Window_001c2550;
  (this->super_IWindow).super_IDisplayable._vptr_IDisplayable = (_func_int **)&DAT_001c2720;
  (this->super_IWindow).super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Window_001c2750;
  (this->super_IWindow).super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Window_001c2778;
  (**(code **)(messageQueue + 0x40))(&messageQueue,&(this->super_IWindow).super_IMessageTarget);
  if (top == this) {
    top = (Window *)0x0;
  }
  if (focused == this) {
    focused = (Window *)0x0;
  }
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x30])(this);
  std::__cxx11::string::~string((string *)&this->title);
  sigslot::
  signal2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  ::~signal2(&this->MouseEvent);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<cursespp::IWindow>)._M_weak_this.
              super___weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Window::~Window() {
    Window::MessageQueue().Unregister(this);
    if (::top == this) { top = nullptr; }
    if (::focused == this) { focused = nullptr; }
    this->Destroy();
}